

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

int prvTidyGetCharEncodingFromOptName(ctmbstr charenc)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = -0x18;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x18 == 0x150) {
      return -1;
    }
    iVar2 = prvTidytmbstrcasecmp(charenc,*(ctmbstr *)((long)&enc2iana[1].tidyOptName + lVar3));
    lVar1 = lVar3 + 0x18;
  } while (iVar2 != 0);
  return *(int *)((long)&enc2iana[1].id + lVar3);
}

Assistant:

int TY_(GetCharEncodingFromOptName)( ctmbstr charenc )
{
    uint i;

    for (i = 0; i < sizeof(enc2iana)/sizeof(enc2iana[0]); ++i)
        if (TY_(tmbstrcasecmp)(charenc, enc2iana[i].tidyOptName) == 0 )
            return enc2iana[i].id;

    return -1;
}